

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O1

void __thiscall BpTree<int>::Delete_Aux(BpTree<int> *this,IndexNode<int> *C,int k,Addr p)

{
  vector<int,_std::allocator<int>_> *__x;
  vector<char,_std::allocator<char>_> *__x_00;
  vector<Addr,_std::allocator<Addr>_> *__x_01;
  Addr *pAVar1;
  pointer piVar2;
  pointer pAVar3;
  Addr *pAVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  pointer pcVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  IndexNode<int> *D_00;
  ulong uVar16;
  size_t sVar17;
  IndexNode<int> *Node;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  IndexNode<int> D;
  IndexNode<int> P;
  IndexNode<int> local_758;
  ulong local_6f8;
  IndexNode<int> local_6f0;
  IndexNode<int> local_690;
  IndexNode<int> local_630;
  IndexNode<int> local_5d0;
  IndexNode<int> local_570;
  IndexNode<int> local_510;
  IndexNode<int> local_4b0;
  IndexNode<int> local_450;
  char local_3f0;
  vector<int,_std::allocator<int>_> local_3e8;
  vector<char,_std::allocator<char>_> local_3d0;
  vector<Addr,_std::allocator<Addr>_> local_3b8;
  Addr local_3a0;
  Addr AStack_398;
  IndexNode<int> local_390;
  IndexNode<int> local_330;
  IndexNode<int> local_2d0;
  IndexNode<int> local_270;
  char local_210;
  vector<int,_std::allocator<int>_> local_208;
  vector<char,_std::allocator<char>_> local_1f0;
  vector<Addr,_std::allocator<Addr>_> local_1d8;
  Addr local_1c0;
  Addr AStack_1b8;
  char local_1b0;
  vector<int,_std::allocator<int>_> local_1a8;
  vector<char,_std::allocator<char>_> local_190;
  vector<Addr,_std::allocator<Addr>_> local_178;
  Addr local_160;
  Addr AStack_158;
  char local_150;
  vector<int,_std::allocator<int>_> local_148;
  vector<char,_std::allocator<char>_> local_130;
  vector<Addr,_std::allocator<Addr>_> local_118;
  Addr local_100;
  Addr AStack_f8;
  IndexNode<int> local_f0;
  IndexNode<int> local_90;
  
  local_3f0 = C->NodeState;
  __x = &C->k;
  std::vector<int,_std::allocator<int>_>::vector(&local_3e8,__x);
  __x_00 = &C->v;
  std::vector<char,_std::allocator<char>_>::vector(&local_3d0,__x_00);
  __x_01 = &C->p;
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_3b8,__x_01);
  local_3a0 = C->parent;
  AStack_398 = C->self;
  Buffer::Lock(&blocks,AStack_398.BlockNum);
  if (local_3b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  IndexNode<int>::IndexNode(&local_758,this->N);
  uVar13 = 0;
  if (1 < this->N) {
    uVar7 = this->N - 1;
    uVar13 = 0;
    do {
      if ((__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[uVar13] == k) goto LAB_00135ba2;
      uVar13 = uVar13 + 1;
    } while (uVar7 != uVar13);
    uVar13 = (ulong)uVar7;
  }
LAB_00135ba2:
  iVar8 = (int)uVar13 + 1;
  iVar9 = this->N;
  if (iVar8 < iVar9 + -1) {
    uVar13 = uVar13 & 0xffffffff;
    do {
      piVar2 = (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      piVar2[uVar13 & 0xffffffff] = piVar2[uVar13 + 1];
      pcVar11 = (__x_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pcVar11[uVar13 & 0xffffffff] = pcVar11[uVar13 + 1];
      iVar9 = this->N;
      uVar13 = uVar13 + 1;
      iVar8 = iVar8 + 1;
    } while (iVar8 < iVar9 + -1);
  }
  (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [(long)iVar9 + -2] = '0';
  local_150 = C->NodeState;
  std::vector<int,_std::allocator<int>_>::vector(&local_148,__x);
  std::vector<char,_std::allocator<char>_>::vector(&local_130,__x_00);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_118,__x_01);
  cVar6 = local_150;
  pAVar1 = &C->parent;
  local_100 = *pAVar1;
  AStack_f8 = C->self;
  if (local_118.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uVar7 = this->N;
  if (cVar6 == '1') {
    uVar13 = 0;
    if (1 < (int)uVar7) {
      uVar13 = 0;
      do {
        if ((__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar13].FileOff == p.FileOff) goto LAB_00135cc0;
        uVar13 = uVar13 + 1;
      } while (uVar7 - 1 != uVar13);
      uVar13 = (ulong)(uVar7 - 1);
    }
LAB_00135cc0:
    iVar8 = (int)uVar13 + 1;
    iVar9 = this->N;
    lVar10 = -0xc;
    lVar14 = -0x10;
    if (iVar8 < iVar9 + -1) {
      uVar13 = uVar13 & 0xffffffff;
      do {
        pAVar3 = (__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pAVar3[uVar13 & 0xffffffff] = pAVar3[uVar13 + 1];
        iVar9 = this->N;
        uVar13 = uVar13 + 1;
        iVar8 = iVar8 + 1;
      } while (iVar8 < iVar9 + -1);
    }
  }
  else {
    if ((int)uVar7 < 1) {
      uVar13 = 0;
    }
    else {
      uVar16 = 0;
      do {
        uVar13 = uVar16;
        if ((__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar16].FileOff == p.FileOff) break;
        uVar16 = uVar16 + 1;
        uVar13 = (ulong)uVar7;
      } while (uVar7 != uVar16);
    }
    iVar8 = (int)uVar13 + 1;
    iVar9 = this->N;
    lVar10 = -4;
    lVar14 = -8;
    if (iVar8 < iVar9) {
      uVar13 = uVar13 & 0xffffffff;
      do {
        pAVar3 = (__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pAVar3[uVar13 & 0xffffffff] = pAVar3[uVar13 + 1];
        iVar9 = this->N;
        uVar13 = uVar13 + 1;
        iVar8 = iVar8 + 1;
      } while (iVar8 < iVar9);
    }
  }
  pAVar3 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
           _M_start;
  *(undefined4 *)((long)&pAVar3[iVar9].BlockNum + lVar14) = 0xffffffff;
  *(undefined4 *)((long)&pAVar3[iVar9].BlockNum + lVar10) = 0xffffffff;
  local_1b0 = C->NodeState;
  std::vector<int,_std::allocator<int>_>::vector(&local_1a8,__x);
  std::vector<char,_std::allocator<char>_>::vector(&local_190,__x_00);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_178,__x_01);
  local_160 = *pAVar1;
  AStack_158 = C->self;
  iVar9 = local_160.FileOff;
  if (local_178.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (iVar9 == -1) {
    local_210 = C->NodeState;
    std::vector<int,_std::allocator<int>_>::vector(&local_208,__x);
    std::vector<char,_std::allocator<char>_>::vector(&local_1f0,__x_00);
    std::vector<Addr,_std::allocator<Addr>_>::vector(&local_1d8,__x_01);
    cVar6 = local_210;
    local_1c0 = *pAVar1;
    AStack_1b8 = C->self;
    if (local_1d8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1d8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1d8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (cVar6 == '1') {
      if (*(__x_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start == '0') {
LAB_0013649f:
        this->RootAddr =
             *(C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data
              ._M_start;
        DeleteNode(this,C);
        goto LAB_00136bd6;
      }
      local_270.NodeState = C->NodeState;
      std::vector<int,_std::allocator<int>_>::vector(&local_270.k,__x);
      std::vector<char,_std::allocator<char>_>::vector(&local_270.v,__x_00);
      std::vector<Addr,_std::allocator<Addr>_>::vector(&local_270.p,__x_01);
      local_270.parent = *pAVar1;
      local_270.self = C->self;
      UpdateBlock(this,&local_270);
      if (local_270.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_270.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_270.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_270.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_270.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_270.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
      if (local_270.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_270.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_270.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_270.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
        local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = local_270.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             local_270.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
      }
    }
    else {
      pAVar4 = (__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pAVar4[1].FileOff == -1) {
        FindNode(this,*pAVar4,&local_758);
        local_758.parent = *pAVar1;
        local_5d0.NodeState = local_758.NodeState;
        std::vector<int,_std::allocator<int>_>::vector(&local_5d0.k,&local_758.k);
        local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        uVar13 = (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (uVar13 == 0) {
          pcVar11 = (pointer)0x0;
        }
        else {
          if ((long)uVar13 < 0) {
            std::__throw_bad_alloc();
          }
          pcVar11 = (pointer)operator_new(uVar13);
        }
        local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pcVar11 + uVar13;
        sVar17 = (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = pcVar11;
        if (sVar17 != 0) {
          local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar11;
          memmove(pcVar11,local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,sVar17);
        }
        local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = pcVar11 + sVar17;
        std::vector<Addr,_std::allocator<Addr>_>::vector(&local_5d0.p,&local_758.p);
        local_5d0.parent = local_758.parent;
        local_5d0.self = local_758.self;
        UpdateBlock(this,&local_5d0);
        if (local_5d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_5d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_5d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_5d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_5d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_5d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_5d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_5d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        goto LAB_0013649f;
      }
      local_2d0.NodeState = C->NodeState;
      std::vector<int,_std::allocator<int>_>::vector(&local_2d0.k,__x);
      std::vector<char,_std::allocator<char>_>::vector(&local_2d0.v,__x_00);
      std::vector<Addr,_std::allocator<Addr>_>::vector(&local_2d0.p,__x_01);
      local_2d0.parent = *pAVar1;
      local_2d0.self = C->self;
      UpdateBlock(this,&local_2d0);
      if (local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    local_330.NodeState = C->NodeState;
    std::vector<int,_std::allocator<int>_>::vector(&local_330.k,__x);
    std::vector<char,_std::allocator<char>_>::vector(&local_330.v,__x_00);
    std::vector<Addr,_std::allocator<Addr>_>::vector(&local_330.p,__x_01);
    local_330.parent = *pAVar1;
    local_330.self = C->self;
    iVar9 = IsFew(this,&local_330);
    if (local_330.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_330.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_330.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_330.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_330.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_330.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_330.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_330.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (iVar9 == 0) {
      local_390.NodeState = C->NodeState;
      std::vector<int,_std::allocator<int>_>::vector(&local_390.k,__x);
      std::vector<char,_std::allocator<char>_>::vector(&local_390.v,__x_00);
      std::vector<Addr,_std::allocator<Addr>_>::vector(&local_390.p,__x_01);
      local_390.parent = *pAVar1;
      local_390.self = C->self;
      UpdateBlock(this,&local_390);
      if (local_390.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_390.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_390.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_390.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_390.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_390.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
      if (local_390.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_390.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_390.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_390.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
        local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = local_390.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             local_390.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
      }
      goto joined_r0x001362ae;
    }
    IndexNode<int>::IndexNode(&local_450,this->N);
    FindNode(this,*pAVar1,&local_450);
    uVar7 = this->N;
    uVar13 = 0;
    if (0 < (int)uVar7) {
      uVar13 = 0;
      do {
        if (local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start[uVar13].FileOff == (C->self).FileOff)
        goto LAB_00135f2d;
        uVar13 = uVar13 + 1;
      } while (uVar7 != uVar13);
      uVar13 = (ulong)uVar7;
    }
LAB_00135f2d:
    iVar9 = (int)uVar13;
    uVar12 = iVar9 + 1;
    uVar15 = 0xffffffff;
    bVar19 = false;
    if (((int)uVar12 < (int)uVar7) &&
       (bVar19 = false,
       local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
       _M_start[uVar12].FileOff != -1)) {
      FindNode(this,local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar12],&local_758);
      bVar18 = iVar9 == 0;
      if (bVar18) {
        local_4b0.NodeState = C->NodeState;
        std::vector<int,_std::allocator<int>_>::vector(&local_4b0.k,__x);
        std::vector<char,_std::allocator<char>_>::vector(&local_4b0.v,__x_00);
        std::vector<Addr,_std::allocator<Addr>_>::vector(&local_4b0.p,__x_01);
        local_4b0.parent = *pAVar1;
        local_4b0.self = C->self;
        local_630.NodeState = local_758.NodeState;
        std::vector<int,_std::allocator<int>_>::vector(&local_630.k,&local_758.k);
        local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        uVar16 = (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (uVar16 == 0) {
          pcVar11 = (pointer)0x0;
        }
        else {
          if ((long)uVar16 < 0) {
            std::__throw_bad_alloc();
          }
          pcVar11 = (pointer)operator_new(uVar16);
        }
        local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pcVar11 + uVar16;
        sVar17 = (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = pcVar11;
        if (sVar17 != 0) {
          local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar11;
          memmove(pcVar11,local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,sVar17);
        }
        local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = pcVar11 + sVar17;
        std::vector<Addr,_std::allocator<Addr>_>::vector(&local_630.p,&local_758.p);
        local_630.parent = local_758.parent;
        local_630.self = local_758.self;
        iVar8 = CanFit(this,&local_4b0,&local_630);
        if (iVar8 == 0) goto LAB_00135f7e;
        bVar18 = true;
        bVar5 = false;
        bVar19 = true;
      }
      else {
LAB_00135f7e:
        if (((int)uVar12 < this->N) &&
           (local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12].FileOff != -1)) {
          IndexNode<int>::IndexNode(&local_90,C);
          IndexNode<int>::IndexNode(&local_f0,&local_758);
          iVar8 = CanFit(this,&local_90,&local_f0);
          bVar19 = iVar8 != 0;
          bVar5 = true;
        }
        else {
          bVar5 = false;
          bVar19 = false;
        }
      }
      if (bVar5) {
        if (local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      if (bVar18) {
        if (local_630.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_630.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_630.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_630.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_630.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_630.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_630.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_630.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_4b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_4b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_4b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_4b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_4b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_4b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_4b0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4b0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_4b0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_4b0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      uVar15 = 0xffffffff;
      if (bVar19) {
        uVar15 = uVar12;
      }
    }
    if (iVar9 != 0) {
      local_6f8 = (ulong)(iVar9 - 1);
      FindNode(this,local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start[local_6f8],&local_758);
      if ((uVar12 == this->N) ||
         (local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12].FileOff == -1)) {
        local_510.NodeState = C->NodeState;
        std::vector<int,_std::allocator<int>_>::vector(&local_510.k,__x);
        std::vector<char,_std::allocator<char>_>::vector(&local_510.v,__x_00);
        std::vector<Addr,_std::allocator<Addr>_>::vector(&local_510.p,__x_01);
        local_510.parent = *pAVar1;
        local_510.self = C->self;
        local_690.NodeState = local_758.NodeState;
        std::vector<int,_std::allocator<int>_>::vector(&local_690.k,&local_758.k);
        local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        uVar16 = (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (uVar16 == 0) {
          pcVar11 = (pointer)0x0;
        }
        else {
          if ((long)uVar16 < 0) {
            std::__throw_bad_alloc();
          }
          pcVar11 = (pointer)operator_new(uVar16);
        }
        local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pcVar11 + uVar16;
        sVar17 = (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = pcVar11;
        if (sVar17 != 0) {
          local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar11;
          memmove(pcVar11,local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,sVar17);
        }
        local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = pcVar11 + sVar17;
        std::vector<Addr,_std::allocator<Addr>_>::vector(&local_690.p,&local_758.p);
        local_690.parent = local_758.parent;
        local_690.self = local_758.self;
        iVar8 = CanFit(this,&local_510,&local_690);
        bVar18 = true;
        bVar5 = true;
        if (iVar8 == 0) goto LAB_00136847;
        bVar5 = false;
        bVar20 = true;
      }
      else {
        bVar5 = false;
LAB_00136847:
        bVar18 = bVar5;
        local_570.NodeState = C->NodeState;
        std::vector<int,_std::allocator<int>_>::vector(&local_570.k,__x);
        std::vector<char,_std::allocator<char>_>::vector(&local_570.v,__x_00);
        std::vector<Addr,_std::allocator<Addr>_>::vector(&local_570.p,__x_01);
        local_570.parent = *pAVar1;
        local_570.self = C->self;
        local_6f0.NodeState = local_758.NodeState;
        std::vector<int,_std::allocator<int>_>::vector(&local_6f0.k,&local_758.k);
        local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        uVar16 = (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (uVar16 == 0) {
          pcVar11 = (pointer)0x0;
        }
        else {
          if ((long)uVar16 < 0) {
            std::__throw_bad_alloc();
          }
          pcVar11 = (pointer)operator_new(uVar16);
        }
        local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pcVar11 + uVar16;
        sVar17 = (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = pcVar11;
        if (sVar17 != 0) {
          local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar11;
          memmove(pcVar11,local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,sVar17);
        }
        local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = pcVar11 + sVar17;
        std::vector<Addr,_std::allocator<Addr>_>::vector(&local_6f0.p,&local_758.p);
        local_6f0.parent = local_758.parent;
        local_6f0.self = local_758.self;
        iVar8 = CanFit(this,&local_570,&local_6f0);
        bVar20 = iVar8 != 0;
        bVar5 = true;
      }
      if (bVar5) {
        if (local_6f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_6f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_6f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_6f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_6f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_6f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_6f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_6f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_570.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_570.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_570.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_570.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_570.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_570.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_570.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_570.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_570.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_570.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_570.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_570.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      if (bVar18) {
        if (local_690.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_690.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_690.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_690.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_690.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_690.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_690.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_690.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_510.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_510.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_510.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_510.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_510.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_510.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_510.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_510.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_510.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_510.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_510.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_510.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      if (bVar20) {
        bVar19 = true;
      }
      if (bVar20) {
        uVar15 = (uint)local_6f8;
      }
    }
    uVar7 = 1;
    if (iVar9 != 0) {
      uVar7 = iVar9 - 1U;
    }
    if (bVar19) {
      uVar7 = uVar15;
    }
    Node = &local_758;
    FindNode(this,local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar7],Node);
    uVar16 = (long)(int)uVar7;
    if (iVar9 < (int)uVar7) {
      uVar16 = uVar13 & 0xffffffff;
    }
    if (bVar19) {
      D_00 = C;
      if (uVar7 != uVar12) {
        if (uVar7 != iVar9 - 1U) goto LAB_00136b7f;
        D_00 = &local_758;
        Node = C;
      }
      Coalesce(this,Node,D_00,
               local_450.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar16]);
    }
    else {
      Redistribute(this,C,&local_758,
                   local_450.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar16],iVar9,uVar7);
    }
LAB_00136b7f:
    if (local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_450.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_450.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    if (local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
      local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_450.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_450.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
    }
  }
joined_r0x001362ae:
  if (local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_00136bd6:
  if (local_758.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_758.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_758.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_758.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_758.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_758.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_758.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_758.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BpTree<K>::Delete_Aux(IndexNode<K>& C, K k, Addr p) {
	this->LockNode(C);
	IndexNode<K> D(N);
	int pos, i, j, m, n, flag = 0;
	for (i = 0; i < N - 1 && C.k[i] != k; i++);
	for (j = i + 1; j < N - 1; j++) {
		C.k[j - 1] = C.k[j];
		C.v[j - 1] = C.v[j];
	}
	C.v[N - 2] = '0';										//ɾ��k
	if (this->IsLeaf(C)) {
		for (i = 0; i < N - 1 && C.p[i].FileOff != p.FileOff; i++);
		for (j = i + 1; j < N - 1; j++) {
			C.p[j - 1] = C.p[j];
		}
		C.p[N - 2] = { -1, -1 };
	}
	else {
		for (i = 0; i < N && C.p[i].FileOff != p.FileOff; i++);
		for (j = i + 1; j < N; j++) {
			C.p[j - 1] = C.p[j];
		}
		C.p[N - 1] = { -1, -1 };
	}														//ɾ��p
	if (this->IsRoot(C)) {
		if (this->IsLeaf(C)) {								//������ֻʣһ�����
			if (C.v[0] == '0') {							//��û�м�ֵ
				this->RootAddr = C.p[0];					//�����
				this->DeleteNode(C);
			}
			else {
				//���м�ֵ������
				this->UpdateBlock(C);
			}
		}
		else {												//�����к���
			if (C.p[1].FileOff == -1) {						//��ֻ��һ������
				this->FindNode(C.p[0], D);
				D.parent = C.parent;
				this->UpdateBlock(D);
				this->RootAddr = C.p[0];
				this->DeleteNode(C);						//��ת�������ĺ���
			}
			else {
				//������и��ຢ�ӣ�����
				this->UpdateBlock(C);
			}
		}
		return;
	}
	//�Ǹ����
	if (!this->IsFew(C)) {
		this->UpdateBlock(C);
		return;
	}
	//ָ�������ֵ��̫�٣����Ǻϲ����߷�̯
	j = -1;
	IndexNode<K> P(N);
	this->FindNode(C.parent, P);
	for (i = 0; i < N && P.p[i].FileOff != C.self.FileOff; i++);	//P.p[i] == C.self
	if (i+1 < N && P.p[i + 1].FileOff != -1) {
		this->FindNode(P.p[i + 1], D);
		if ((i == 0 && CanFit(C, D) ||
			(i + 1 < N && P.p[i + 1].FileOff != -1 && CanFit(C, D)))) {
			j = i + 1;		//��������֮�ɺϲ�����D = P_i+1
			flag = 1;
		}
	}
	if (i > 0) {
		this->FindNode(P.p[i - 1], D);
		if (((i + 1 == N || P.p[i + 1].FileOff == -1) && CanFit(C, D)) ||
			(i > 0 && CanFit(C, D))) {
			j = i - 1;		//��������֮�ɺϲ�����D = P_i-1
			flag = 1;
		}
	}
	//�������ڽԿɺϲ�ʱ������ѡD = P_i-1
	if (!flag) {
		j = (i == 0) ? 1 : i - 1;
		//���Ҳ����ɺϲ����ھӣ�����ѡ���ھ�
	}
	this->FindNode(P.p[j], D);
	K k2 = (i < j) ? P.k[i] : P.k[j];
	if (flag) {
		//�ϲ�����
		if (j == i + 1) {
			this->Coalesce(D, C, k2);
		}
		else if(j == i-1) {
			this->Coalesce(C, D, k2);
		}
	}
	else {
		//��̯����
		this->Redistribute(C, D, k2, i, j);
	}
	return;
}